

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O0

void __thiscall batch_helper::~batch_helper(batch_helper *this)

{
  batch_helper *this_local;
  
  ~batch_helper(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

bool batch_helper::prepare_target_name(const cl_parser& cl)
{
	if (cl.get_string("-dir", m_output_folder)) {
		if (!xr_file_system::folder_exist(m_output_folder) && !xr_file_system::instance().create_folder(m_output_folder)) {
			msg("output folder does not exist");
			return false;
		}
		xr_file_system::append_path_separator(m_output_folder);
	} else if (cl.get_string("-out", m_output_file)) {
		if (cl.num_params() > 1) {
			msg("explicitly specified output file expects single input file");
			return false;
		}
	}
	return true;
}